

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcGen.c
# Opt level: O1

void Abc_WriteBooth(FILE *pFile,int nVars)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  
  uVar4 = nVars;
  if (1 < (uint)nVars) {
    uVar4 = 0;
    uVar2 = nVars - 1;
    if (uVar2 != 0) {
      do {
        uVar4 = uVar4 + 1;
        bVar1 = 9 < uVar2;
        uVar2 = uVar2 / 10;
      } while (bVar1);
    }
  }
  uVar2 = nVars * 2;
  uVar11 = (ulong)uVar2;
  if (nVars != 0) {
    uVar11 = 0;
    uVar6 = uVar2 - 1;
    do {
      uVar11 = (ulong)((int)uVar11 + 1);
      bVar1 = 9 < uVar6;
      uVar6 = uVar6 / 10;
    } while (bVar1);
  }
  if (nVars < 1) {
    __assert_fail("nVars > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcGen.c"
                  ,0x448,"void Abc_WriteBooth(FILE *, int)");
  }
  fprintf((FILE *)pFile,".model Multi%d\n",(ulong)(uint)nVars);
  fwrite(".inputs",7,1,(FILE *)pFile);
  uVar3 = 0;
  do {
    fprintf((FILE *)pFile," a%0*d",(ulong)uVar4,uVar3);
    uVar6 = (int)uVar3 + 1;
    uVar3 = (ulong)uVar6;
  } while (nVars != uVar6);
  uVar6 = 0;
  do {
    fprintf((FILE *)pFile," b%0*d",(ulong)uVar4,(ulong)uVar6);
    uVar6 = uVar6 + 1;
  } while (nVars != uVar6);
  fputc(10,(FILE *)pFile);
  fwrite(".outputs",8,1,(FILE *)pFile);
  uVar6 = 1;
  if (1 < (int)uVar2) {
    uVar6 = uVar2;
  }
  uVar7 = 0;
  do {
    fprintf((FILE *)pFile," m%0*d",uVar11,(ulong)uVar7);
    uVar7 = uVar7 + 1;
  } while (uVar6 != uVar7);
  fputc(10,(FILE *)pFile);
  Abc_WriteBoothPartialProducts(pFile,nVars);
  uVar7 = 0;
  do {
    fprintf((FILE *)pFile,".names x%0*d_%0*d\n",(ulong)uVar4,0,uVar11,(ulong)uVar7);
    uVar7 = uVar7 + 1;
  } while (uVar6 != uVar7);
  uVar7 = 0;
  if (0 < (int)uVar2) {
    uVar7 = uVar2;
  }
  uVar3 = 0;
  do {
    fprintf((FILE *)pFile,".subckt ADD%d",(ulong)uVar2);
    uVar10 = 0;
    do {
      iVar8 = (int)uVar3;
      fprintf((FILE *)pFile," a%0*d=x%0*d_%0*d",uVar11,uVar10,(ulong)uVar4,uVar3,uVar11,uVar10);
      uVar9 = (int)uVar10 + 1;
      uVar10 = (ulong)uVar9;
    } while (uVar6 != uVar9);
    uVar10 = 0;
    do {
      fprintf((FILE *)pFile," b%0*d=y%0*d_%0*d",uVar11,uVar10,(ulong)uVar4,uVar3,uVar11,uVar10);
      uVar9 = (int)uVar10 + 1;
      uVar10 = (ulong)uVar9;
    } while (uVar6 != uVar9);
    uVar9 = iVar8 + 1;
    uVar3 = 0;
    do {
      fprintf((FILE *)pFile," s%0*d=x%0*d_%0*d",uVar11,uVar3,(ulong)uVar4,(ulong)uVar9,uVar11,uVar3)
      ;
      uVar5 = (int)uVar3 + 1;
      uVar3 = (ulong)uVar5;
    } while (uVar7 + 1 != uVar5);
    fputc(10,(FILE *)pFile);
    uVar3 = (ulong)uVar9;
  } while (iVar8 != (nVars - (nVars + 1 >> 0x1f)) + 1 >> 1);
  uVar6 = 1;
  if (1 < (int)uVar2) {
    uVar6 = uVar2;
  }
  uVar3 = 0;
  do {
    fprintf((FILE *)pFile,".names x%0*d_%0*d m%0*d\n1 1\n",(ulong)uVar4,(ulong)uVar9,uVar11,uVar3,
            uVar11,uVar3);
    uVar7 = (int)uVar3 + 1;
    uVar3 = (ulong)uVar7;
  } while (uVar6 != uVar7);
  fwrite(".end\n",5,1,(FILE *)pFile);
  fputc(10,(FILE *)pFile);
  Abc_WriteAdder(pFile,uVar2);
  return;
}

Assistant:

void Abc_WriteBooth( FILE * pFile, int nVars )
{
    int i, k, nDigits = Abc_Base10Log( nVars ), nDigits2 = Abc_Base10Log( 2*nVars );
    int Length = 1+(nVars + 1)/2;

    assert( nVars > 0 );
    fprintf( pFile, ".model Multi%d\n", nVars );

    fprintf( pFile, ".inputs" );
    for ( i = 0; i < nVars; i++ )
        fprintf( pFile, " a%0*d", nDigits, i );
    for ( i = 0; i < nVars; i++ )
        fprintf( pFile, " b%0*d", nDigits, i );
    fprintf( pFile, "\n" );

    fprintf( pFile, ".outputs" );
    for ( i = 0; i < 2*nVars; i++ )
        fprintf( pFile, " m%0*d", nDigits2, i );
    fprintf( pFile, "\n" );

    Abc_WriteBoothPartialProducts( pFile, nVars );

    for ( i = 0; i < 2*nVars; i++ )
        fprintf( pFile, ".names x%0*d_%0*d\n", nDigits, 0, nDigits2, i );
    for ( k = 0; k < Length; k++ )
    {
        fprintf( pFile, ".subckt ADD%d", 2*nVars );
        for ( i = 0; i < 2*nVars; i++ )
            fprintf( pFile, " a%0*d=x%0*d_%0*d", nDigits2, i, nDigits, k, nDigits2, i );
        for ( i = 0; i < 2*nVars; i++ )
            fprintf( pFile, " b%0*d=y%0*d_%0*d", nDigits2, i, nDigits, k, nDigits2, i );
        for ( i = 0; i <= 2*nVars; i++ )
            fprintf( pFile, " s%0*d=x%0*d_%0*d", nDigits2, i, nDigits, k+1, nDigits2, i );
        fprintf( pFile, "\n" );
    }
    for ( i = 0; i < 2 * nVars; i++ )
        fprintf( pFile, ".names x%0*d_%0*d m%0*d\n1 1\n", nDigits, k, nDigits2, i, nDigits2, i );
    fprintf( pFile, ".end\n" ); 
    fprintf( pFile, "\n" );
    Abc_WriteAdder( pFile, 2*nVars );
}